

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColorCircle.cpp
# Opt level: O1

void __thiscall ColorCircle::showLine(ColorCircle *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  int iVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  if (0 < (this->super_Colored).state_) {
    iVar7 = 0;
    glColor3ub(0,0,0);
    glLineWidth((float)(this->super_Colored).line_width_);
    glBegin(2);
    iVar6 = this->shape_n_;
    if (0 < iVar6) {
      do {
        dVar1 = (this->super_Colored).shape_scale_;
        dVar2 = (this->super_Colored).x_;
        dVar3 = this->r_;
        dVar8 = (double)iVar7 / (double)iVar6;
        dVar9 = cos((dVar8 + dVar8) * 3.141592653589);
        dVar8 = (this->super_Colored).shape_scale_;
        dVar4 = this->r_;
        dVar5 = (this->super_Colored).y_;
        dVar10 = (double)iVar7 / (double)this->shape_n_;
        dVar10 = sin((dVar10 + dVar10) * 3.141592653589);
        Colored::myglVertex2d
                  (&this->super_Colored,dVar9 * dVar1 * dVar3 + dVar2,dVar8 * dVar4 * dVar10 + dVar5
                  );
        iVar7 = iVar7 + 1;
        iVar6 = this->shape_n_;
      } while (iVar7 < iVar6);
    }
    glEnd();
    return;
  }
  return;
}

Assistant:

void ColorCircle::showLine(){
    if(state_ > 0){
        glColor3ub(0, 0, 0);
        glLineWidth((float)line_width_);
        glBegin(GL_LINE_LOOP);
        for(int i=0; i<shape_n_; i++)
        {
            double xx = x_ + shape_scale_ * r_ * cos( ((double)i)/shape_n_ * 2 * MYPI );
            double yy = y_ + shape_scale_ * r_ * sin( ((double)i)/shape_n_ * 2 * MYPI );
            myglVertex2d(xx,yy);
        }
        glEnd();
    }
}